

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O0

void lyext_load_plugins(void)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  LY_ERR *pLVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  lyext_plugin_list *plVar10;
  undefined8 *puVar11;
  char *local_188;
  char *local_158;
  char *pluginsdir;
  uint v;
  uint u;
  lyext_plugin_complex *pluginc;
  lyext_plugin_list *p;
  lyext_plugin_list *plugin;
  void *dlhandler;
  char name [255];
  char *str;
  size_t len;
  dirent *file;
  DIR *dir;
  
  local_158 = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
  if (local_158 == (char *)0x0) {
    local_158 = "/usr/local/lib/libyang";
  }
  __dirp = opendir(local_158);
  if (__dirp == (DIR *)0x0) {
    if ('\0' < ly_log_level) {
      ly_log(LY_LLWRN,"libyang extensions plugins directory \"%s\" does not exist.",local_158);
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&ext_lock);
LAB_00193aa9:
    pdVar4 = readdir(__dirp);
    if (pdVar4 != (dirent *)0x0) {
      if ((((pdVar4->d_type == '\b') || (pdVar4->d_type != '\n')) &&
          (sVar5 = strlen(pdVar4->d_name), 3 < sVar5)) &&
         (iVar3 = strcmp(pdVar4->d_name + (sVar5 - 3),".so"), iVar3 == 0)) {
        memcpy(&dlhandler,pdVar4->d_name,sVar5 - 3);
        *(undefined1 *)((long)&plugin + sVar5 + 5) = 0;
        asprintf((char **)(name + 0xf8),"%s/%s",local_158,pdVar4->d_name);
        plugin = (lyext_plugin_list *)dlopen(stack0xffffffffffffffd8,6);
        dlerror();
        if (plugin == (lyext_plugin_list *)0x0) {
          plugin = (lyext_plugin_list *)dlopen(stack0xffffffffffffffd8,2);
          if (plugin == (lyext_plugin_list *)0x0) {
            pLVar6 = ly_errno_location();
            pvVar2 = stack0xffffffffffffffd8;
            *pLVar6 = LY_ESYS;
            uVar7 = dlerror();
            ly_log(LY_LLERR,"Loading \"%s\" as an extension plugin failed (%s).",pvVar2,uVar7);
            free(stack0xffffffffffffffd8);
          }
          else {
            if ('\x01' < ly_log_level) {
              ly_log(LY_LLVRB,"Extension plugin \"%s\" successfully loaded.",stack0xffffffffffffffd8
                    );
            }
            free(stack0xffffffffffffffd8);
            dlerror();
            lVar8 = dlsym(plugin,&dlhandler);
            register0x00000000 = (void *)dlerror();
            if (register0x00000000 == (void *)0x0) {
              pluginsdir._4_4_ = 0;
              while (*(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x10) != 0) {
                for (pluginsdir._0_4_ = 0; (uint)pluginsdir < ext_plugins_count;
                    pluginsdir._0_4_ = (uint)pluginsdir + 1) {
                  iVar3 = strcmp(*(char **)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x10),
                                 ext_plugins[(uint)pluginsdir].name);
                  if (((iVar3 == 0) &&
                      (iVar3 = strcmp(*(char **)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20),
                                      ext_plugins[(uint)pluginsdir].module), iVar3 == 0)) &&
                     ((*(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 8) == 0 ||
                      ((ext_plugins[(uint)pluginsdir].revision == (char *)0x0 ||
                       (iVar3 = strcmp(*(char **)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 8),
                                       ext_plugins[(uint)pluginsdir].revision), iVar3 == 0)))))) {
                    pLVar6 = ly_errno_location();
                    *pLVar6 = LY_ESYS;
                    pcVar9 = "";
                    if (*(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 8) != 0) {
                      pcVar9 = "@";
                    }
                    if (*(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 8) == 0) {
                      local_188 = "";
                    }
                    else {
                      local_188 = *(char **)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 8);
                    }
                    ly_log(LY_LLERR,
                           "Processing \"%s\" extension plugin failed,implementation collision for extension %s from module %s%s%s."
                           ,&dlhandler,
                           *(undefined8 *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x10),
                           *(undefined8 *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20),pcVar9,local_188)
                    ;
                    dlclose(plugin);
                    goto LAB_00193aa9;
                  }
                }
                if ((**(int **)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x18) == 1) &&
                   (*(long *)(*(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x18) + 0x20) != 0)
                   ) {
                  lVar1 = *(long *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x18);
                  pluginsdir._0_4_ = 0;
                  while (*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18) != 0) {
                    if (((0x37 < *(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18))
                        || (*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18) ==
                            0x13)) ||
                       (*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18) == 0x16))
                    {
                      pLVar6 = ly_errno_location();
                      *pLVar6 = LY_EINVAL;
                      ly_log(LY_LLERR,
                             "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)"
                             ,&dlhandler,
                             *(undefined8 *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x10),
                             ly_stmt_str
                             [*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18)]);
                      dlclose(plugin);
                      goto LAB_00193aa9;
                    }
                    if (((1 < *(uint *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18 +
                                       0x10)) &&
                        (0x13 < *(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18)))
                       && (*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18) < 0x1b
                          )) {
                      pLVar6 = ly_errno_location();
                      *pLVar6 = LY_EINVAL;
                      ly_log(LY_LLERR,
                             "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" substatement, which is not supported."
                             ,&dlhandler,
                             *(undefined8 *)(lVar8 + (ulong)pluginsdir._4_4_ * 0x20 + 0x10),
                             ly_stmt_str
                             [*(int *)(*(long *)(lVar1 + 0x20) + (ulong)(uint)pluginsdir * 0x18)]);
                      dlclose(plugin);
                      goto LAB_00193aa9;
                    }
                    pluginsdir._0_4_ = (uint)pluginsdir + 1;
                  }
                }
                pluginsdir._4_4_ = pluginsdir._4_4_ + 1;
              }
              plVar10 = (lyext_plugin_list *)
                        realloc(ext_plugins,(ulong)(ext_plugins_count + pluginsdir._4_4_) << 5);
              if (plVar10 == (lyext_plugin_list *)0x0) {
                pLVar6 = ly_errno_location();
                *pLVar6 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyext_load_plugins");
                dlclose(plugin);
                closedir(__dirp);
                pthread_mutex_unlock((pthread_mutex_t *)&ext_lock);
                return;
              }
              for (; ext_plugins = plVar10, pluginsdir._4_4_ != 0;
                  pluginsdir._4_4_ = pluginsdir._4_4_ - 1) {
                plVar10 = ext_plugins + ext_plugins_count;
                puVar11 = (undefined8 *)(lVar8 + (ulong)(pluginsdir._4_4_ - 1) * 0x20);
                plVar10->module = (char *)*puVar11;
                plVar10->revision = (char *)puVar11[1];
                plVar10->name = (char *)puVar11[2];
                plVar10->plugin = (lyext_plugin *)puVar11[3];
                ext_plugins_count = ext_plugins_count + 1;
                plVar10 = ext_plugins;
              }
              ly_set_add(&dlhandlers,plugin,1);
            }
            else {
              pLVar6 = ly_errno_location();
              *pLVar6 = LY_ESYS;
              ly_log(LY_LLERR,
                     "Processing \"%s\" extension plugin failed, missing plugin list object (%s).",
                     &dlhandler,stack0xffffffffffffffd8);
              dlclose(plugin);
            }
          }
        }
        else {
          if ('\x01' < ly_log_level) {
            ly_log(LY_LLVRB,"Extension plugin \"%s\" already loaded.",stack0xffffffffffffffd8);
          }
          free(stack0xffffffffffffffd8);
          dlclose(plugin);
        }
      }
      goto LAB_00193aa9;
    }
    closedir(__dirp);
    pthread_mutex_unlock((pthread_mutex_t *)&ext_lock);
  }
  return;
}

Assistant:

API void
lyext_load_plugins(void)
{
    DIR* dir;
    struct dirent *file;
    size_t len;
    char *str;
    char name[NAME_MAX];
    void *dlhandler;
    struct lyext_plugin_list *plugin, *p;
    struct lyext_plugin_complex *pluginc;
    unsigned int u, v;
    const char *pluginsdir;

    /* try to get the plugins directory from environment variable */
    pluginsdir = getenv("LIBYANG_EXTENSIONS_PLUGINS_DIR");
    if (!pluginsdir) {
        pluginsdir = LYEXT_PLUGINS_DIR;
    }

    dir = opendir(pluginsdir);
    if (!dir) {
        /* no directory (or no access to it), no plugins */
        LOGWRN("libyang extensions plugins directory \"%s\" does not exist.", pluginsdir);
        return;
    }

    /* lock the extension plugins list */
    pthread_mutex_lock(&ext_lock);

    while ((file = readdir(dir))) {
        if (file->d_type != DT_REG && file->d_type == DT_LNK) {
            /* other files than regular and symbolic links are ignored */
            continue;
        }

        /* required format of the filename is *LYEXT_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LYEXT_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LYEXT_PLUGIN_SUFFIX_LEN], LYEXT_PLUGIN_SUFFIX)) {
            continue;
        }

        /* store the name without the suffix */
        memcpy(name, file->d_name, len - LYEXT_PLUGIN_SUFFIX_LEN);
        name[len - LYEXT_PLUGIN_SUFFIX_LEN] = '\0';

        /* and construct the filepath */
        asprintf(&str, "%s/%s", pluginsdir, file->d_name);

        /* load the plugin - first, try if it is already loaded... */
        dlhandler = dlopen(str, RTLD_NOW | RTLD_NOLOAD);
        dlerror();    /* Clear any existing error */
        if (dlhandler) {
            /* the plugin is already loaded */
            LOGVRB("Extension plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }

        /* ... and if not, load it */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(LY_ESYS, "Loading \"%s\" as an extension plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        LOGVRB("Extension plugin \"%s\" successfully loaded.", str);
        free(str);
        dlerror();    /* Clear any existing error */

        /* get the plugin data */
        plugin = dlsym(dlhandler, name);
        str = dlerror();
        if (str) {
            LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed, missing plugin list object (%s).", name, str);
            dlclose(dlhandler);
            continue;
        }

        for(u = 0; plugin[u].name; u++) {
            /* check extension implementations for collisions */
            for (v = 0; v < ext_plugins_count; v++) {
                if (!strcmp(plugin[u].name, ext_plugins[v].name) &&
                        !strcmp(plugin[u].module, ext_plugins[v].module) &&
                        (!plugin[u].revision || !ext_plugins[v].revision || !strcmp(plugin[u].revision, ext_plugins[v].revision))) {
                    LOGERR(LY_ESYS, "Processing \"%s\" extension plugin failed,"
                           "implementation collision for extension %s from module %s%s%s.",
                           name, plugin[u].name, plugin[u].module, plugin[u].revision ? "@" : "",
                           plugin[u].revision ? plugin[u].revision : "");
                    dlclose(dlhandler);
                    goto nextplugin;
                }
            }

            /* check for valid supported substatements in case of complex extension */
            if (plugin[u].plugin->type == LYEXT_COMPLEX && ((struct lyext_plugin_complex *)plugin[u].plugin)->substmt) {
                pluginc = (struct lyext_plugin_complex *)plugin[u].plugin;
                for (v = 0; pluginc->substmt[v].stmt; v++) {
                    if (pluginc->substmt[v].stmt >= LY_STMT_SUBMODULE ||
                            pluginc->substmt[v].stmt == LY_STMT_VERSION ||
                            pluginc->substmt[v].stmt == LY_STMT_YINELEM) {
                        LOGERR(LY_EINVAL,
                               "Extension plugin \"%s\" (extension %s) allows not supported extension substatement (%s)",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                    if (pluginc->substmt[v].cardinality > LY_STMT_CARD_MAND &&
                             pluginc->substmt[v].stmt >= LY_STMT_MODIFIER &&
                             pluginc->substmt[v].stmt <= LY_STMT_STATUS) {
                        LOGERR(LY_EINVAL, "Extension plugin \"%s\" (extension %s) allows multiple instances on \"%s\" "
                               "substatement, which is not supported.",
                               name, plugin[u].name, ly_stmt_str[pluginc->substmt[v].stmt]);
                        dlclose(dlhandler);
                        goto nextplugin;
                    }
                }
            }
        }


        /* add the new plugins, we have number of new plugins as u */
        p = realloc(ext_plugins, (ext_plugins_count + u) * sizeof *ext_plugins);
        if (!p) {
            LOGMEM;
            dlclose(dlhandler);
            closedir(dir);

            /* unlock the global structures */
            pthread_mutex_unlock(&ext_lock);

            return;
        }
        ext_plugins = p;
        for( ; u; u--) {
            memcpy(&ext_plugins[ext_plugins_count], &plugin[u - 1], sizeof *plugin);
            ext_plugins_count++;
        }

        /* keep the handler */
        ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);

nextplugin:;
    }

    closedir(dir);

    /* unlock the global structures */
    pthread_mutex_unlock(&ext_lock);
}